

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.cpp
# Opt level: O0

void __thiscall
ev3dev::i2c_sensor::i2c_sensor
          (i2c_sensor *this,address_type *address,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *types)

{
  string *in_RSI;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_000001b0;
  address_type *in_stack_000001b8;
  sensor *in_stack_000001c0;
  string local_38 [56];
  
  std::__cxx11::string::string(local_38,in_RSI);
  sensor::sensor(in_stack_000001c0,in_stack_000001b8,in_stack_000001b0);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

i2c_sensor::i2c_sensor(address_type address, const std::set<sensor_type> &types)
    : sensor(address, types)
{ }